

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detonation_PDU.cpp
# Opt level: O0

KBOOL __thiscall KDIS::PDU::Detonation_PDU::operator==(Detonation_PDU *this,Detonation_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  Descriptor *this_00;
  Descriptor *Value_00;
  Detonation_PDU *Value_local;
  Detonation_PDU *this_local;
  
  KVar1 = Warfare_Header::operator!=(&this->super_Warfare_Header,&Value->super_Warfare_Header);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else {
    KVar1 = DATA_TYPE::Vector::operator!=(&this->m_Velocity,&Value->m_Velocity);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else {
      KVar1 = DATA_TYPE::WorldCoordinates::operator!=
                        (&this->m_LocationWorldCoords,&Value->m_LocationWorldCoords);
      if (KVar1) {
        this_local._7_1_ = false;
      }
      else {
        this_00 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::operator*(&this->m_pDescriptor);
        Value_00 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::operator*(&Value->m_pDescriptor);
        KVar1 = DATA_TYPE::Descriptor::operator!=(this_00,Value_00);
        if (KVar1) {
          this_local._7_1_ = false;
        }
        else {
          KVar1 = DATA_TYPE::Vector::operator!=
                            (&this->m_LocationEntityCoords,&Value->m_LocationEntityCoords);
          if (KVar1) {
            this_local._7_1_ = false;
          }
          else if (this->m_ui8DetonationResult == Value->m_ui8DetonationResult) {
            if (this->m_ui8NumOfVariableParams == Value->m_ui8NumOfVariableParams) {
              bVar2 = std::operator!=(&this->m_vVariableParameters,&Value->m_vVariableParameters);
              if (bVar2) {
                this_local._7_1_ = false;
              }
              else {
                this_local._7_1_ = true;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

KBOOL Detonation_PDU::operator == ( const Detonation_PDU & Value ) const
{
    if( Warfare_Header::operator !=( Value ) )                       return false;
    if( m_Velocity               != Value.m_Velocity )               return false;
    if( m_LocationWorldCoords    != Value.m_LocationWorldCoords )    return false;
    if( *m_pDescriptor           != *Value.m_pDescriptor )          return false;
    if( m_LocationEntityCoords   != Value.m_LocationEntityCoords )   return false;
    if( m_ui8DetonationResult    != Value.m_ui8DetonationResult )    return false;
    if( m_ui8NumOfVariableParams != Value.m_ui8NumOfVariableParams ) return false;
    if( m_vVariableParameters    != Value.m_vVariableParameters )    return false;
    return true;
}